

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

SourceFile * __thiscall hdc::Driver::parseFile(Driver *this,string *path)

{
  Logger *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  SourceFile *sfile;
  long *plVar5;
  void *__buf;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar7;
  Parser parser;
  long *local_330;
  long local_320;
  undefined4 uStack_318;
  undefined4 uStack_314;
  long *local_310;
  long local_308;
  long local_300;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  char *local_2d0 [2];
  char local_2c0 [16];
  string local_2b0;
  Parser local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int aiStack_218 [122];
  
  paVar1 = &local_290.filePath.field_2;
  local_290.tokens.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290.current_token._M_current = (Token *)0x0;
  local_290.tokens.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.tokens.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.matched._M_current = (Token *)0x0;
  local_290.filePath._M_string_length = 0;
  local_290.filePath.field_2._M_local_buf[0] = '\0';
  local_290.filePath._M_dataplus._M_p = (pointer)paVar1;
  std::operator+(&local_238,"parsing file \'",path);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  this_00 = &this->logger;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    uVar6 = (undefined4)*plVar5;
    uVar7 = *(undefined4 *)((long)plVar4 + 0x14);
    local_300 = *plVar5;
    uStack_2f8 = (undefined4)plVar4[3];
    uStack_2f4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_310 = &local_300;
  }
  else {
    local_300 = *plVar5;
    uVar6 = extraout_XMM0_Da;
    uVar7 = extraout_XMM0_Db;
    local_310 = (long *)*plVar4;
  }
  local_308 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Logger::log(this_00,(double)CONCAT44(uVar7,uVar6));
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  pcVar3 = (path->_M_dataplus)._M_p;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar3,pcVar3 + path->_M_string_length);
  sfile = Program::getSourceFile(&this->program,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (sfile == (SourceFile *)0x0) {
    pcVar3 = (path->_M_dataplus)._M_p;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d0,pcVar3,pcVar3 + path->_M_string_length);
    std::ifstream::ifstream(&local_238,local_2d0[0],_S_in);
    iVar2 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
    std::ifstream::~ifstream(&local_238);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0]);
    }
    if (iVar2 == 0) {
      Parser::setLogger(&local_290,this_00);
      pcVar3 = (path->_M_dataplus)._M_p;
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,pcVar3,pcVar3 + path->_M_string_length);
      sfile = (SourceFile *)Parser::read(&local_290,(int)local_2f0,__buf,(size_t)plVar5);
      if (local_2f0[0] != local_2e0) {
        operator_delete(local_2f0[0]);
      }
      Program::addSourceFile(&this->program,sfile);
    }
    else {
      std::operator+(&local_238,"couldn\'t find file or directory \'",path);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        uVar6 = (undefined4)*plVar5;
        uVar7 = *(undefined4 *)((long)plVar4 + 0x14);
        local_320 = *plVar5;
        uStack_318 = (undefined4)plVar4[3];
        uStack_314 = *(undefined4 *)((long)plVar4 + 0x1c);
        local_330 = &local_320;
      }
      else {
        local_320 = *plVar5;
        uVar6 = extraout_XMM0_Da_00;
        uVar7 = extraout_XMM0_Db_00;
        local_330 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      Logger::log(this_00,(double)CONCAT44(uVar7,uVar6));
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      Logger::quit(this_00);
      sfile = (SourceFile *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.filePath._M_dataplus._M_p != paVar1) {
    operator_delete(local_290.filePath._M_dataplus._M_p);
  }
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::~vector(&local_290.tokens);
  return sfile;
}

Assistant:

SourceFile* Driver::parseFile(std::string path) {
    Parser parser;
    SourceFile* file;

    logger.log(LOG_INTERNAL_DRIVER, "parsing file '" + path + "'");
    file = program.getSourceFile(path);

    if (file != nullptr) {
        return file;
    }

    if (!fileExists(path)) {
        logger.log(LOG_ERROR, "couldn't find file or directory '" + path + "'");
        logger.quit();
        return nullptr;
    }

    parser.setLogger(&logger);
    file = parser.read(path);
    program.addSourceFile(file);

    return file;
}